

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

int lws_vhost_active_conns(lws *wsi,lws **nwsi,char *adsin)

{
  uint uVar1;
  lws_dll2_owner *plVar2;
  lws_dll2 *plVar3;
  lws_role_ops *plVar4;
  lws_role_ops *plVar5;
  ulong uVar6;
  int iVar7;
  lws *plVar8;
  uint uVar9;
  lws_dll2 *plVar10;
  lws *plVar11;
  lws *w;
  lws_dll2 *local_40;
  lws **local_38;
  
  plVar2 = (wsi->dll2_cli_txn_queue).owner;
  if (plVar2 == (lws_dll2_owner *)0x0) {
    plVar11 = (wsi->mux).parent_wsi;
    if (plVar11 == (lws *)0x0) {
      local_40 = &wsi->dll2_cli_txn_queue;
      plVar3 = (wsi->vhost->dll_cli_active_conns_owner).head;
      local_38 = nwsi;
      do {
        do {
          plVar10 = plVar3;
          if (plVar10 == (lws_dll2 *)0x0) {
            return 0;
          }
          plVar3 = plVar10->next;
          plVar11 = (lws *)(plVar10 + -0x12);
          w = plVar11;
          _lws_log(0x10,"%s: check %p %p %s %s %d %d\n","lws_vhost_active_conns",wsi,plVar11,adsin,
                   plVar10[6].owner,(ulong)wsi->c_port,
                   (ulong)*(ushort *)((long)&plVar10[0xc].owner + 6));
        } while (plVar11 == wsi);
        plVar4 = (lws_role_ops *)plVar10[4].owner;
        plVar5 = wsi->role_ops;
      } while ((((plVar4 != plVar5) &&
                ((plVar4 != &role_ops_h1 && plVar4 != &role_ops_h2 ||
                 (plVar5 != &role_ops_h1 && plVar5 != &role_ops_h2)))) ||
               (plVar10[6].owner == (lws_dll2_owner *)0x0)) ||
              (((iVar7 = strcmp(adsin,(char *)plVar10[6].owner), iVar7 != 0 ||
                (((*(uint *)&plVar10[0xb].prev ^ (wsi->tls).use_ssl) & 1) != 0)) ||
               (wsi->c_port != *(uint16_t *)((long)&plVar10[0xc].owner + 6)))));
      uVar6 = *(ulong *)((long)&plVar10[0xc].next + 4);
      if ((uVar6 >> 0x33 & 1) != 0) {
        _lws_log(4,"defeating pipelining due to no keepalive on server\n");
        return 0;
      }
      if (((~uVar6 & 0x140000000000000) == 0) &&
         (((uVar1 = *(uint *)((long)&plVar10[0xb].next + 4), uVar9 = uVar1 & 0xffff,
           (short)uVar1 == 0x11 || (uVar9 == 0x119)) || (uVar9 == 0x10f)))) {
        _lws_log(4,"%s: just join h2 directly 0x%x\n","lws_vhost_active_conns");
        if (*(short *)((long)&plVar10[0xb].next + 4) == 0x11) {
          _lws_generic_transaction_completed_active_conn(&w);
          plVar11 = w;
        }
        wsi->field_0x2e2 = wsi->field_0x2e2 | 0x40;
        lws_wsi_h2_adopt(plVar11,wsi);
        *local_38 = w;
      }
      else {
        if (((plVar5 != &role_ops_mqtt) || ((uVar6 & 0x100000000000000) == 0)) ||
           ((*(short *)((long)&plVar10[0xb].next + 4) != 0x119 ||
            (plVar8 = lws_wsi_mqtt_adopt(plVar11,wsi), plVar8 == (lws *)0x0)))) {
          _lws_log(4,"%s: apply %p to txn queue on %p state 0x%lx\n","lws_vhost_active_conns",wsi,
                   plVar11,(ulong)*(uint *)((long)&plVar10[0xb].next + 4));
          lws_dll2_add_tail(local_40,(lws_dll2_owner *)(plVar10 + 2));
          if (*(short *)((long)&plVar10[0xb].next + 4) == 0x11) {
            _lws_generic_transaction_completed_active_conn(&w);
            plVar11 = w;
          }
          *local_38 = plVar11;
          goto LAB_00113927;
        }
        _lws_log(4,"%s: join mqtt directly\n","lws_vhost_active_conns");
        lws_dll2_remove(local_40);
        wsi->field_0x2e2 = wsi->field_0x2e2 | 0x80;
      }
    }
    else {
      *nwsi = plVar11;
    }
    iVar7 = 1;
  }
  else {
    *nwsi = (lws *)(plVar2 + -0x14);
LAB_00113927:
    iVar7 = 2;
  }
  return iVar7;
}

Assistant:

int
lws_vhost_active_conns(struct lws *wsi, struct lws **nwsi, const char *adsin)
{
	if (!lws_dll2_is_detached(&wsi->dll2_cli_txn_queue)) {
		struct lws *w = lws_container_of(
				wsi->dll2_cli_txn_queue.owner, struct lws,
				dll2_cli_txn_queue_owner);
		*nwsi = w;

		return ACTIVE_CONNS_QUEUED;
	}

#if defined(LWS_ROLE_H2) || defined(LWS_ROLE_MQTT)
	if (wsi->mux.parent_wsi) {
		/*
		 * We already decided...
		 */

		*nwsi = wsi->mux.parent_wsi;

		return ACTIVE_CONNS_MUXED;
	}
#endif

	lws_vhost_lock(wsi->vhost); /* ----------------------------------- { */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   wsi->vhost->dll_cli_active_conns_owner.head) {
		struct lws *w = lws_container_of(d, struct lws,
						 dll_cli_active_conns);

		lwsl_debug("%s: check %p %p %s %s %d %d\n", __func__, wsi, w,
			    adsin, w->cli_hostname_copy, wsi->c_port, w->c_port);

		if (w != wsi &&
		    /*
		     * "same internet protocol"... this is a bit tricky,
		     * since h2 start out as h1
		     */
		    (w->role_ops == wsi->role_ops ||
		     (lwsi_role_http(w) && lwsi_role_http(wsi))) &&
		    w->cli_hostname_copy &&
		    !strcmp(adsin, w->cli_hostname_copy) &&
#if defined(LWS_WITH_TLS)
		    (wsi->tls.use_ssl & LCCSCF_USE_SSL) ==
		     (w->tls.use_ssl & LCCSCF_USE_SSL) &&
#endif
		    wsi->c_port == w->c_port) {

			/*
			 * There's already an active connection.
			 *
			 * The server may have told the existing active
			 * connection that it doesn't support pipelining...
			 */
			if (w->keepalive_rejected) {
				lwsl_notice("defeating pipelining due to no "
					  "keepalive on server\n");
				goto solo;
			}

#if defined(LWS_WITH_HTTP2)
			/*
			 * h2: if in usable state already: just use it without
			 *     going through the queue
			 */
			if (w->client_h2_alpn && w->client_mux_migrated &&
			    (lwsi_state(w) == LRS_H2_WAITING_TO_SEND_HEADERS ||
			     lwsi_state(w) == LRS_ESTABLISHED ||
			     lwsi_state(w) == LRS_IDLING)) {

				lwsl_notice("%s: just join h2 directly 0x%x\n",
						__func__, lwsi_state(w));

				if (lwsi_state(w) == LRS_IDLING) {
					// lwsi_set_state(w, LRS_ESTABLISHED);
					_lws_generic_transaction_completed_active_conn(&w);
				}

				//lwsi_set_state(w, LRS_H1C_ISSUE_HANDSHAKE2);

				wsi->client_h2_alpn = 1;
				lws_wsi_h2_adopt(w, wsi);
				lws_vhost_unlock(wsi->vhost); /* } ---------- */

				*nwsi = w;

				return ACTIVE_CONNS_MUXED;
			}
#endif

#if defined(LWS_ROLE_MQTT)
			/*
			 * MQTT: if in usable state already: just use it without
			 *	 going through the queue
			 */

			if (lwsi_role_mqtt(wsi) && w->client_mux_migrated &&
			    lwsi_state(w) == LRS_ESTABLISHED) {

				if (lws_wsi_mqtt_adopt(w, wsi)) {
					lwsl_notice("%s: join mqtt directly\n", __func__);
					lws_dll2_remove(&wsi->dll2_cli_txn_queue);
					wsi->client_mux_substream = 1;

					lws_vhost_unlock(wsi->vhost); /* } ---------- */


					return ACTIVE_CONNS_MUXED;
				}
			}
#endif

			/*
			 * If the connection is viable but not yet in a usable
			 * state, let's attach ourselves to it and wait for it
			 * to get there or fail.
			 */

			lwsl_notice("%s: apply %p to txn queue on %p state 0x%lx\n",
				  __func__, wsi, w, (unsigned long)w->wsistate);
			/*
			 * ...let's add ourselves to his transaction queue...
			 * we are adding ourselves at the TAIL
			 */
			lws_dll2_add_tail(&wsi->dll2_cli_txn_queue,
					  &w->dll2_cli_txn_queue_owner);

			if (lwsi_state(w) == LRS_IDLING) {
				// lwsi_set_state(w, LRS_ESTABLISHED);
				_lws_generic_transaction_completed_active_conn(&w);
			}

			/*
			 * For eg, h1 next we'd pipeline our headers out on him,
			 * and wait for our turn at client transaction_complete
			 * to take over parsing the rx.
			 */
			lws_vhost_unlock(wsi->vhost); /* } ---------- */

			*nwsi = w;

			return ACTIVE_CONNS_QUEUED;
		}

	} lws_end_foreach_dll_safe(d, d1);

solo:
	lws_vhost_unlock(wsi->vhost); /* } ---------------------------------- */

	/* there is nobody already connected in the same way */

	return ACTIVE_CONNS_SOLO;
}